

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  stbi__uint16 *__ptr;
  stbi__uint16 *image;
  ulong uVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    image = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel == 8) {
      iVar7 = req_comp;
      if (req_comp == 0) {
        iVar7 = *comp;
      }
      iVar7 = *y * *x * iVar7;
      image = (stbi__uint16 *)malloc((long)(iVar7 * 2));
      if (image == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
        image = (stbi__uint16 *)0x0;
      }
      else {
        if (0 < iVar7) {
          auVar10 = vpbroadcastq_avx512f();
          uVar6 = 0;
          auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar15 = vmovdqa64_avx512f(_DAT_001c9380);
          do {
            auVar16 = vpbroadcastq_avx512f();
            auVar17 = vporq_avx512f(auVar16,auVar11);
            auVar18 = vporq_avx512f(auVar16,auVar12);
            auVar19 = vporq_avx512f(auVar16,auVar13);
            auVar16 = vporq_avx512f(auVar16,auVar14);
            uVar1 = vpcmpuq_avx512f(auVar16,auVar10,2);
            uVar2 = vpcmpuq_avx512f(auVar19,auVar10,2);
            uVar3 = vpcmpuq_avx512f(auVar18,auVar10,2);
            uVar4 = vpcmpuq_avx512f(auVar17,auVar10,2);
            bVar5 = (byte)uVar4;
            uVar8 = CONCAT11(bVar5,(byte)uVar3);
            uVar9 = CONCAT22(uVar8,CONCAT11((byte)uVar2,(byte)uVar1));
            auVar16._0_32_ = vmovdqu8_avx512vl(*(undefined1 (*) [32])((long)__ptr + uVar6));
            auVar17[1] = ((byte)(uVar9 >> 1) & 1) * auVar16[1];
            auVar17[0] = ((byte)uVar1 & 1) * auVar16[0];
            auVar17[2] = ((byte)(uVar9 >> 2) & 1) * auVar16[2];
            auVar17[3] = ((byte)(uVar9 >> 3) & 1) * auVar16[3];
            auVar17[4] = ((byte)(uVar9 >> 4) & 1) * auVar16[4];
            auVar17[5] = ((byte)(uVar9 >> 5) & 1) * auVar16[5];
            auVar17[6] = ((byte)(uVar9 >> 6) & 1) * auVar16[6];
            auVar17[7] = ((byte)(uVar9 >> 7) & 1) * auVar16[7];
            auVar17[8] = ((byte)uVar2 & 1) * auVar16[8];
            auVar17[9] = ((byte)(uVar9 >> 9) & 1) * auVar16[9];
            auVar17[10] = ((byte)(uVar9 >> 10) & 1) * auVar16[10];
            auVar17[0xb] = ((byte)(uVar9 >> 0xb) & 1) * auVar16[0xb];
            auVar17[0xc] = ((byte)(uVar9 >> 0xc) & 1) * auVar16[0xc];
            auVar17[0xd] = ((byte)(uVar9 >> 0xd) & 1) * auVar16[0xd];
            auVar17[0xe] = ((byte)(uVar9 >> 0xe) & 1) * auVar16[0xe];
            auVar17[0xf] = ((byte)(uVar9 >> 0xf) & 1) * auVar16[0xf];
            auVar17[0x10] = ((byte)uVar3 & 1) * auVar16[0x10];
            auVar17[0x11] = ((byte)(uVar8 >> 1) & 1) * auVar16[0x11];
            auVar17[0x12] = ((byte)(uVar8 >> 2) & 1) * auVar16[0x12];
            auVar17[0x13] = ((byte)(uVar8 >> 3) & 1) * auVar16[0x13];
            auVar17[0x14] = ((byte)(uVar8 >> 4) & 1) * auVar16[0x14];
            auVar17[0x15] = ((byte)(uVar8 >> 5) & 1) * auVar16[0x15];
            auVar17[0x16] = ((byte)(uVar8 >> 6) & 1) * auVar16[0x16];
            auVar17[0x17] = ((byte)(uVar8 >> 7) & 1) * auVar16[0x17];
            auVar17[0x18] = (bVar5 & 1) * auVar16[0x18];
            auVar17[0x19] = (bVar5 >> 1 & 1) * auVar16[0x19];
            auVar17[0x1a] = (bVar5 >> 2 & 1) * auVar16[0x1a];
            auVar17[0x1b] = (bVar5 >> 3 & 1) * auVar16[0x1b];
            auVar17[0x1c] = (bVar5 >> 4 & 1) * auVar16[0x1c];
            auVar17._30_34_ = auVar16._30_34_;
            auVar17[0x1d] = (bVar5 >> 5 & 1) * auVar16[0x1d];
            auVar16 = vpermb_avx512_vbmi(auVar15,ZEXT3264(auVar17._0_32_));
            auVar16 = vmovdqu16_avx512bw(auVar16);
            *(undefined1 (*) [64])(image + uVar6) = auVar16;
            uVar6 = uVar6 + 0x20;
          } while ((iVar7 + 0x1fU & 0xffffffe0) != uVar6);
        }
        free(__ptr);
      }
      local_3c.bits_per_channel = 0x10;
    }
    else {
      image = __ptr;
      if (local_3c.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                      ,0x481,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp * 2);
    }
  }
  return image;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 16) {
      STBI_ASSERT(ri.bits_per_channel == 8);
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}